

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_s32__msadpcm(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint64 dVar1;
  drwav_int32 *in_RDX;
  ulong in_RSI;
  drwav *in_RDI;
  drwav_uint64 samplesRead;
  drwav_int16 samples16 [2048];
  drwav_uint64 totalSamplesRead;
  drwav_int16 *in_stack_ffffffffffffefb8;
  drwav_int16 local_1028 [2052];
  drwav_uint64 local_20;
  drwav_int32 *local_18;
  ulong local_10;
  drwav *local_8;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (local_10 == 0) {
      return local_20;
    }
    dVar1 = local_10;
    if (0x7ff < local_10) {
      dVar1 = 0x800;
    }
    dVar1 = drwav_read_s16(local_8,dVar1,in_stack_ffffffffffffefb8);
    if (dVar1 == 0) break;
    drwav_s16_to_s32(local_18,local_1028,dVar1);
    local_18 = local_18 + dVar1;
    local_10 = local_10 - dVar1;
    local_20 = dVar1 + local_20;
  }
  return local_20;
}

Assistant:

drwav_uint64 drwav_read_s32__msadpcm(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut)
{
    // We're just going to borrow the implementation from the drwav_read_s16() since ADPCM is a little bit more complicated than other formats and I don't
    // want to duplicate that code.
    drwav_uint64 totalSamplesRead = 0;
    drwav_int16 samples16[2048];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read_s16(pWav, drwav_min(samplesToRead, 2048), samples16);
        if (samplesRead == 0) {
            break;
        }

        drwav_s16_to_s32(pBufferOut, samples16, (size_t)samplesRead);   // <-- Safe cast because we're clamping to 2048.

        pBufferOut       += samplesRead;
        samplesToRead    -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}